

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

EmptyArgumentExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::EmptyArgumentExpression,slang::ast::Type_const&,slang::SourceRange>
          (BumpAllocator *this,Type *args,SourceRange *args_1)

{
  SourceLocation SVar1;
  SourceLocation SVar2;
  EmptyArgumentExpression *pEVar3;
  
  pEVar3 = (EmptyArgumentExpression *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((EmptyArgumentExpression *)this->endPtr < pEVar3 + 1) {
    pEVar3 = (EmptyArgumentExpression *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pEVar3 + 1);
  }
  SVar1 = args_1->startLoc;
  SVar2 = args_1->endLoc;
  (pEVar3->super_Expression).kind = EmptyArgument;
  (pEVar3->super_Expression).type.ptr = args;
  (pEVar3->super_Expression).constant = (ConstantValue *)0x0;
  (pEVar3->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (pEVar3->super_Expression).sourceRange.startLoc = SVar1;
  (pEVar3->super_Expression).sourceRange.endLoc = SVar2;
  return pEVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }